

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line.c
# Opt level: O0

line * lalloc(int used)

{
  int iVar1;
  line *lp;
  line *plStack_10;
  int used_local;
  
  plStack_10 = (line *)malloc(0x20);
  if (plStack_10 == (line *)0x0) {
    plStack_10 = (line *)0x0;
  }
  else {
    plStack_10->l_text = (char *)0x0;
    plStack_10->l_size = 0;
    plStack_10->l_used = used;
    iVar1 = lrealloc(plStack_10,used);
    if (iVar1 == 0) {
      free(plStack_10);
      plStack_10 = (line *)0x0;
    }
  }
  return plStack_10;
}

Assistant:

struct line *
lalloc(int used)
{
	struct line *lp;

	if ((lp = malloc(sizeof(*lp))) == NULL)
		return (NULL);
	lp->l_text = NULL;
	lp->l_size = 0;
	lp->l_used = used;	/* XXX */
	if (lrealloc(lp, used) == FALSE) {
		free(lp);
		return (NULL);
	}
	return (lp);
}